

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaffeConverter.cpp
# Opt level: O0

convertCaffeLayerFn *
caffeLayerRegistry(convertCaffeLayerFn *__return_storage_ptr__,string *layerType)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>_>
  __l;
  bool bVar1;
  pointer pvVar2;
  ostream *poVar3;
  runtime_error *this;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  *local_f20;
  string local_ef8 [32];
  stringstream local_ed8 [8];
  stringstream ss;
  ostream local_ec8 [376];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>,_true>
  local_d50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>,_true>
  local_d48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>,_true>
  *local_d40;
  const_iterator *it;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  *local_d28;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_d20;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_ce0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_ca0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_c60;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_c20;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_be0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_ba0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_b60;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_b20;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_ae0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_aa0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_a60;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_a20;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_9e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_9a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_960;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_920;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_8e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_8a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_860;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_820;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_7e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_7a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_760;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_720;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_6e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_6a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_660;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_620;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_5e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_5a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_560;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_520;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_4e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_4a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_460;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_420;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_3e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_3a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_360;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_320;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_2e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_2a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_260;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_220;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_1e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_1a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_160;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_a0;
  iterator local_60;
  size_type local_58;
  undefined1 local_50 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>_>_>
  CAFFE_LAYER_REGISTRY;
  string *layerType_local;
  
  local_d28 = &local_d20;
  CAFFE_LAYER_REGISTRY._M_h._M_single_bucket = (__node_base_ptr)layerType;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[5],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [5])0xbbc17e,CoreMLConverter::convertCaffeActivation);
  local_d28 = &local_ce0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[5],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [5])"BNLL",CoreMLConverter::convertCaffeActivation);
  local_d28 = &local_ca0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[6],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [6])0xbbc17d,CoreMLConverter::convertCaffeActivation);
  local_d28 = &local_c60;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[4],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [4])0xbbc256,CoreMLConverter::convertCaffeActivation);
  local_d28 = &local_c20;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[8],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [8])0xba025d,CoreMLConverter::convertCaffeActivation);
  local_d28 = &local_be0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[5],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [5])"TanH",CoreMLConverter::convertCaffeActivation);
  local_d28 = &local_ba0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[10],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [10])0xbab73e,CoreMLConverter::convertCaffeParameter);
  local_d28 = &local_b60;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[13],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [13])"InnerProduct",CoreMLConverter::convertCaffeInnnerProduct);
  local_d28 = &local_b20;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[12],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [12])"Convolution",CoreMLConverter::convertCaffeConvolution);
  local_d28 = &local_ae0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[14],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [14])"Deconvolution",CoreMLConverter::convertCaffeConvolution);
  local_d28 = &local_aa0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[4],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [4])"LRN",CoreMLConverter::convertCaffeLRN);
  local_d28 = &local_a60;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[8],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [8])"Softmax",CoreMLConverter::convertCaffeSoftmax);
  local_d28 = &local_a20;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[8],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [8])"Pooling",CoreMLConverter::convertCaffePooling);
  local_d28 = &local_9e0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[7],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [7])"Concat",CoreMLConverter::convertCaffeConcat);
  local_d28 = &local_9a0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[5],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [5])0xbba44b,CoreMLConverter::convertCaffeLSTM);
  local_d28 = &local_960;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[8],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [8])"Eltwise",CoreMLConverter::convertCaffeEltwise);
  local_d28 = &local_920;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[6],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [6])"Slice",CoreMLConverter::convertCaffeSlice);
  local_d28 = &local_8e0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[8],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [8])"Flatten",CoreMLConverter::convertCaffeFlatten);
  local_d28 = &local_8a0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[6],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [6])"Embed",CoreMLConverter::convertCaffeEmbed);
  local_d28 = &local_860;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[6],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [6])"Split",CoreMLConverter::convertCaffeSplit);
  local_d28 = &local_820;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[10],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [10])"BatchNorm",CoreMLConverter::convertCaffeBatchnorm);
  local_d28 = &local_7e0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[6],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [6])"Input",CoreMLConverter::convertCaffeInputLayers);
  local_d28 = &local_7a0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[10],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [10])"ImageData",CoreMLConverter::convertCaffeInputLayers);
  local_d28 = &local_760;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[20],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [20])"ImageDataMultiLabel",CoreMLConverter::convertCaffeInputLayers
            );
  local_d28 = &local_720;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[5],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [5])0xb8006d,CoreMLConverter::convertCaffeInputLayers);
  local_d28 = &local_6e0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[9],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [9])"HDF5Data",CoreMLConverter::convertCaffeInputLayers);
  local_d28 = &local_6a0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[11],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [11])"WindowData",CoreMLConverter::convertCaffeInputLayers);
  local_d28 = &local_660;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[11],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [11])"MemoryData",CoreMLConverter::convertCaffeInputLayers);
  local_d28 = &local_620;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[10],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [10])"DummyData",CoreMLConverter::convertCaffeInputLayers);
  local_d28 = &local_5e0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[11],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [11])"HDF5Output",CoreMLConverter::convertCaffeTrainingLayers);
  local_d28 = &local_5a0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[5],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [5])0xb8a57b,CoreMLConverter::convertCaffeTrainingLayers);
  local_d28 = &local_560;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[13],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [13])"InfogainLoss",CoreMLConverter::convertCaffeTrainingLayers);
  local_d28 = &local_520;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[14],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [14])"EuclideanLoss",CoreMLConverter::convertCaffeTrainingLayers);
  local_d28 = &local_4e0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[8],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [8])"Dropout",CoreMLConverter::convertCaffeTrainingLayers);
  local_d28 = &local_4a0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[24],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [24])"SigmoidCrossEntropyLoss",
             CoreMLConverter::convertCaffeTrainingLayers);
  local_d28 = &local_460;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[10],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [10])"HingeLoss",CoreMLConverter::convertCaffeTrainingLayers);
  local_d28 = &local_420;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[20],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [20])"HingeLossMultiLabel",
             CoreMLConverter::convertCaffeTrainingLayers);
  local_d28 = &local_3e0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[9],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [9])"Accuracy",CoreMLConverter::convertCaffeTrainingLayers);
  local_d28 = &local_3a0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[16],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [16])"ContrastiveLoss",CoreMLConverter::convertCaffeTrainingLayers)
  ;
  local_d28 = &local_360;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[16],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [16])"SoftmaxWithLoss",CoreMLConverter::convertCaffeTrainingLayers)
  ;
  local_d28 = &local_320;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[7],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [7])"Python",CoreMLConverter::convertCaffeTrainingLayers);
  local_d28 = &local_2e0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[10],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [10])"Reduction",CoreMLConverter::convertCaffeReduction);
  local_d28 = &local_2a0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[6],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [6])"Scale",CoreMLConverter::convertCaffeScale);
  local_d28 = &local_260;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[5],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [5])0xb7f544,CoreMLConverter::convertCaffeBias);
  local_d28 = &local_220;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[4],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [4])"MVN",CoreMLConverter::convertCaffeMVN);
  local_d28 = &local_1e0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[7],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [7])"AbsVal",CoreMLConverter::convertCaffeAbs);
  local_d28 = &local_1a0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[4],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [4])"Exp",CoreMLConverter::convertCaffeExp);
  local_d28 = &local_160;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[6],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [6])"Power",CoreMLConverter::convertCaffePower);
  local_d28 = &local_120;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[4],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [4])"Log",CoreMLConverter::convertCaffeLog);
  local_d28 = &local_e0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[5],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [5])"Crop",CoreMLConverter::convertCaffeCrop);
  local_d28 = &local_a0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[8],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (local_d28,(char (*) [8])"Reshape",CoreMLConverter::convertCaffeReshape);
  local_60 = &local_d20;
  local_58 = 0x33;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>_>
  ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>_>
               *)((long)&it + 1));
  __l._M_len = local_58;
  __l._M_array = local_60;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>_>_>
                   *)local_50,__l,0,(hasher *)((long)&it + 3),(key_equal *)((long)&it + 2),
                  (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>_>
                   *)((long)&it + 1));
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>_>
                *)((long)&it + 1));
  local_f20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
               *)&local_60;
  do {
    local_f20 = local_f20 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
    ::~pair(local_f20);
  } while (local_f20 != &local_d20);
  local_d48._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>_>_>
               *)local_50,(key_type *)CAFFE_LAYER_REGISTRY._M_h._M_single_bucket);
  local_d40 = &local_d48;
  local_d50._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>_>_>
              *)local_50);
  bVar1 = std::__detail::operator!=(&local_d48,&local_d50);
  if (!bVar1) {
    std::__cxx11::stringstream::stringstream(local_ed8);
    poVar3 = std::operator<<(local_ec8,"Cannot convert caffe layer of type \'");
    poVar3 = std::operator<<(poVar3,(string *)CAFFE_LAYER_REGISTRY._M_h._M_single_bucket);
    poVar3 = std::operator<<(poVar3,"\'.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(this,local_ef8);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar2 = std::__detail::
           _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>,_false,_true>
           ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>,_false,_true>
                         *)local_d40);
  std::function<void_(CoreMLConverter::ConvertLayerParameters)>::function
            (__return_storage_ptr__,&pvVar2->second);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>_>_>
                    *)local_50);
  return __return_storage_ptr__;
}

Assistant:

CoreMLConverter::convertCaffeLayerFn
static caffeLayerRegistry(const std::string& layerType) {
    
    const std::unordered_map<std::string, CoreMLConverter::convertCaffeLayerFn> CAFFE_LAYER_REGISTRY {
        {"ReLU", CoreMLConverter::convertCaffeActivation},
        {"BNLL", CoreMLConverter::convertCaffeActivation},
        {"PReLU", CoreMLConverter::convertCaffeActivation},
        {"ELU", CoreMLConverter::convertCaffeActivation},
        {"Sigmoid", CoreMLConverter::convertCaffeActivation},
        {"TanH", CoreMLConverter::convertCaffeActivation},
        {"Parameter", CoreMLConverter::convertCaffeParameter},
        {"InnerProduct", CoreMLConverter::convertCaffeInnnerProduct},
        {"Convolution", CoreMLConverter::convertCaffeConvolution},
        {"Deconvolution", CoreMLConverter::convertCaffeConvolution},
        {"LRN", CoreMLConverter::convertCaffeLRN},
        {"Softmax", CoreMLConverter::convertCaffeSoftmax},
        {"Pooling", CoreMLConverter::convertCaffePooling},
        {"Concat", CoreMLConverter::convertCaffeConcat},
        {"LSTM", CoreMLConverter::convertCaffeLSTM},
        {"Eltwise",CoreMLConverter::convertCaffeEltwise},
        {"Slice",CoreMLConverter::convertCaffeSlice},
        {"Flatten",CoreMLConverter::convertCaffeFlatten},
        {"Embed",CoreMLConverter::convertCaffeEmbed},
        {"Split",CoreMLConverter::convertCaffeSplit},
        {"BatchNorm",CoreMLConverter::convertCaffeBatchnorm},
        {"Input",CoreMLConverter::convertCaffeInputLayers},
        {"ImageData",CoreMLConverter::convertCaffeInputLayers},
        {"ImageDataMultiLabel",CoreMLConverter::convertCaffeInputLayers},
        {"Data",CoreMLConverter::convertCaffeInputLayers},
        {"HDF5Data",CoreMLConverter::convertCaffeInputLayers},
        {"WindowData",CoreMLConverter::convertCaffeInputLayers},
        {"MemoryData",CoreMLConverter::convertCaffeInputLayers},
        {"DummyData",CoreMLConverter::convertCaffeInputLayers},
        {"HDF5Output",CoreMLConverter::convertCaffeTrainingLayers},
        {"Loss",CoreMLConverter::convertCaffeTrainingLayers},
        {"InfogainLoss",CoreMLConverter::convertCaffeTrainingLayers},
        {"EuclideanLoss",CoreMLConverter::convertCaffeTrainingLayers},
        {"Dropout",CoreMLConverter::convertCaffeTrainingLayers},
        {"SigmoidCrossEntropyLoss",CoreMLConverter::convertCaffeTrainingLayers},
        {"HingeLoss",CoreMLConverter::convertCaffeTrainingLayers},
        {"HingeLossMultiLabel",CoreMLConverter::convertCaffeTrainingLayers},
        {"Accuracy",CoreMLConverter::convertCaffeTrainingLayers},
        {"ContrastiveLoss",CoreMLConverter::convertCaffeTrainingLayers},
        {"SoftmaxWithLoss",CoreMLConverter::convertCaffeTrainingLayers},
        {"Python",CoreMLConverter::convertCaffeTrainingLayers},
        {"Reduction",CoreMLConverter::convertCaffeReduction},
        {"Scale",CoreMLConverter::convertCaffeScale},
        {"Bias",CoreMLConverter::convertCaffeBias},
        {"MVN",CoreMLConverter::convertCaffeMVN},
        {"AbsVal",CoreMLConverter::convertCaffeAbs},
        {"Exp",CoreMLConverter::convertCaffeExp},
        {"Power",CoreMLConverter::convertCaffePower},
        {"Log",CoreMLConverter::convertCaffeLog},
        {"Crop",CoreMLConverter::convertCaffeCrop},
        {"Reshape",CoreMLConverter::convertCaffeReshape}
    };
    
    // Find the layer in the global registry.
    const auto& it = CAFFE_LAYER_REGISTRY.find(layerType);
    if (it != CAFFE_LAYER_REGISTRY.end()) {
        return it->second;
        
    // Layer type not supported.
    } else {
        std::stringstream ss;
        ss << "Cannot convert caffe layer of type '" << layerType << "'." << std::endl;
        throw std::runtime_error(ss.str());
    }
}